

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.h
# Opt level: O0

QEasingCurve * __thiscall QEasingCurve::operator=(QEasingCurve *this,QEasingCurve *other)

{
  QEasingCurve *in_RSI;
  QEasingCurve *in_RDI;
  long in_FS_OFFSET;
  QEasingCurve copy;
  QEasingCurve local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != in_RSI) {
    local_10.d_ptr = (QEasingCurvePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    ::QEasingCurve::QEasingCurve(&local_10,(QEasingCurve *)in_RSI);
    swap(in_RSI,in_RDI);
    ::QEasingCurve::~QEasingCurve(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QEasingCurve &operator=(const QEasingCurve &other)
    { if ( this != &other ) { QEasingCurve copy(other); swap(copy); } return *this; }